

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmPreModify(LlvmCompilationContext *ctx,ExprPreModify *node)

{
  LLVMBuilderRef pLVar1;
  bool bVar2;
  int iVar3;
  LLVMValueRef pLVar4;
  TypeRef *pTVar5;
  LLVMValueRef pLVar6;
  TypeBase *type;
  LLVMTypeRef pLVar7;
  LLVMValueRef pLVar8;
  double local_58;
  TypeBase *stackType;
  LLVMValueRef value;
  TypeRef *refType;
  LLVMValueRef address;
  ExprPreModify *node_local;
  LlvmCompilationContext *ctx_local;
  
  pLVar4 = CompileLlvm(ctx,node->value);
  pTVar5 = getType<TypeRef>(node->value->type);
  if (pTVar5 != (TypeRef *)0x0) {
    pLVar6 = LLVMBuildLoad(ctx->builder,pLVar4,"");
    pLVar6 = ConvertToStackType(ctx,pLVar6,pTVar5->subType);
    type = GetStackType(ctx,pTVar5->subType);
    bVar2 = ExpressionContext::IsIntegerType(ctx->ctx,type);
    if (bVar2) {
      pLVar1 = ctx->builder;
      pLVar7 = CompileLlvmType(ctx,type);
      iVar3 = -1;
      if ((node->isIncrement & 1U) != 0) {
        iVar3 = 1;
      }
      pLVar8 = LLVMConstInt(pLVar7,(long)iVar3,true);
      stackType = (TypeBase *)LLVMBuildAdd(pLVar1,pLVar6,pLVar8,"");
    }
    else {
      pLVar1 = ctx->builder;
      pLVar7 = CompileLlvmType(ctx,type);
      local_58 = 1.0;
      if ((node->isIncrement & 1U) == 0) {
        local_58 = -1.0;
      }
      pLVar8 = LLVMConstReal(pLVar7,local_58);
      stackType = (TypeBase *)LLVMBuildFAdd(pLVar1,pLVar6,pLVar8,"");
    }
    pLVar1 = ctx->builder;
    pLVar6 = ConvertToDataType(ctx,(LLVMValueRef)stackType,type,pTVar5->subType);
    LLVMBuildStore(pLVar1,pLVar6,pLVar4);
    pLVar4 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)stackType);
    return pLVar4;
  }
  __assert_fail("refType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x319,
                "LLVMValueRef CompileLlvmPreModify(LlvmCompilationContext &, ExprPreModify *)");
}

Assistant:

LLVMValueRef CompileLlvmPreModify(LlvmCompilationContext &ctx, ExprPreModify *node)
{
	LLVMValueRef address = CompileLlvm(ctx, node->value);

	TypeRef *refType = getType<TypeRef>(node->value->type);

	assert(refType);

	LLVMValueRef value = ConvertToStackType(ctx, LLVMBuildLoad(ctx.builder, address, ""), refType->subType);

	TypeBase *stackType = GetStackType(ctx, refType->subType);

	if(ctx.ctx.IsIntegerType(stackType))
		value = LLVMBuildAdd(ctx.builder, value, LLVMConstInt(CompileLlvmType(ctx, stackType), node->isIncrement ? 1 : -1, true), "");
	else
		value = LLVMBuildFAdd(ctx.builder, value, LLVMConstReal(CompileLlvmType(ctx, stackType), node->isIncrement ? 1.0 : -1.0), "");

	LLVMBuildStore(ctx.builder, ConvertToDataType(ctx, value, stackType, refType->subType), address);

	return CheckType(ctx, node, value);
}